

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::Load
          (CompressedTriangleFans *this,BinaryStream *bstream,unsigned_long *iterator,
          bool decodeTrianglesOrder,O3DGCStreamType streamType)

{
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    LoadUIntData(&this->m_numTFANs,bstream,iterator);
    LoadUIntData(&this->m_degrees,bstream,iterator);
    LoadUIntData(&this->m_configs,bstream,iterator);
    LoadBinData(&this->m_operations,bstream,iterator);
    LoadIntData(&this->m_indices,bstream,iterator);
    if (decodeTrianglesOrder) {
      LoadUIntData(&this->m_trianglesOrder,bstream,iterator);
    }
  }
  else {
    LoadIntACEGC(&this->m_numTFANs,4,bstream,iterator);
    LoadIntACEGC(&this->m_degrees,0x10,bstream,iterator);
    LoadUIntAC(&this->m_configs,10,bstream,iterator);
    LoadBinAC(&this->m_operations,bstream,iterator);
    LoadIntACEGC(&this->m_indices,8,bstream,iterator);
    if (decodeTrianglesOrder) {
      LoadIntACEGC(&this->m_trianglesOrder,0x10,bstream,iterator);
    }
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::Load(const BinaryStream & bstream,
                                                   unsigned long & iterator, 
                                                   bool decodeTrianglesOrder,
                                                   O3DGCStreamType streamType) 
    {
#ifdef DEBUG_VERBOSE
        g_fileDebugTF = fopen("Load_new.txt", "w");
#endif //DEBUG_VERBOSE
        if (streamType == O3DGC_STREAM_TYPE_ASCII)
        {
            LoadUIntData(m_numTFANs  , bstream, iterator);
            LoadUIntData(m_degrees   , bstream, iterator);
            LoadUIntData(m_configs   , bstream, iterator);
            LoadBinData (m_operations, bstream, iterator);
            LoadIntData (m_indices   , bstream, iterator);
            if (decodeTrianglesOrder)
            {
                LoadUIntData(m_trianglesOrder , bstream, iterator);
            }
        }
        else
        {
            LoadIntACEGC(m_numTFANs  , 4 , bstream, iterator);
            LoadIntACEGC(m_degrees   , 16, bstream, iterator);
            LoadUIntAC  (m_configs   , 10, bstream, iterator);
            LoadBinAC   (m_operations,     bstream, iterator);
            LoadIntACEGC(m_indices   , 8 , bstream, iterator);
            if (decodeTrianglesOrder)
            {
                LoadIntACEGC(m_trianglesOrder , 16, bstream, iterator);
            }
        }

#ifdef DEBUG_VERBOSE
        fclose(g_fileDebugTF);
#endif //DEBUG_VERBOSE
        return O3DGC_OK;
    }